

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O0

USBPacket * __thiscall
USBPacket::GetDataPayloadField
          (USBPacket *this,int offset,int bcnt,U8 address,char *name,USBCtrlTransFieldType formatter
          ,U8 flags)

{
  U32 data;
  const_reference pvVar1;
  int bcnt_00;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  undefined4 in_register_0000008c;
  undefined3 in_stack_00000009;
  undefined1 local_58 [8];
  USBCtrlTransFieldFrame f;
  char *name_local;
  U8 address_local;
  int bcnt_local;
  int offset_local;
  USBPacket *this_local;
  
  f._36_4_ = in_register_0000008c;
  f._32_4_ = formatter;
  bcnt_00 = (int)CONCAT71(in_register_00000009,address);
  USBCtrlTransFieldFrame::USBCtrlTransFieldFrame((USBCtrlTransFieldFrame *)local_58);
  this_00 = &((USBPacket *)CONCAT44(in_register_00000034,offset))->mBitBeginSamples;
  pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (this_00,(long)(bcnt * 8 + 0x10));
  local_58 = (undefined1  [8])*pvVar1;
  pvVar1 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (this_00,(long)((bcnt + bcnt_00) * 8 + 0x10));
  f._0_8_ = *pvVar1;
  data = GetDataPayload((USBPacket *)CONCAT44(in_register_00000034,offset),bcnt,bcnt_00);
  USBCtrlTransFieldFrame::PackFrame
            ((USBCtrlTransFieldFrame *)local_58,data,address,(U8)name,_flags,(char *)f._32_8_);
  Frame::Frame((Frame *)this,(Frame *)local_58);
  USBCtrlTransFieldFrame::~USBCtrlTransFieldFrame((USBCtrlTransFieldFrame *)local_58);
  return this;
}

Assistant:

Frame USBPacket::GetDataPayloadField( int offset, int bcnt, U8 address, const char* name, USBCtrlTransFieldType formatter, U8 flags ) const
{
    USBCtrlTransFieldFrame f;
    f.mFlags = flags;
    f.mStartingSampleInclusive = mBitBeginSamples[ 16 + offset * 8 ];          // first data bit
    f.mEndingSampleInclusive = mBitBeginSamples[ 16 + ( offset + bcnt ) * 8 ]; // first bit after

    f.PackFrame( GetDataPayload( offset, bcnt ), bcnt, address, formatter, name );

    return f;
}